

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void __thiscall UnitTestBasehello11::Run(UnitTestBasehello11 *this)

{
  bool bVar1;
  Regex t;
  UnitTestBase *in_stack_fffffffffffffd28;
  UnitTestBase *in_stack_fffffffffffffd30;
  char *in_stack_fffffffffffffd38;
  allocator *paVar2;
  Regex *in_stack_fffffffffffffd40;
  undefined8 in_stack_fffffffffffffd50;
  undefined2 uVar3;
  undefined7 in_stack_fffffffffffffd58;
  undefined1 in_stack_fffffffffffffd5f;
  undefined1 uVar4;
  UnitTestBase *in_stack_fffffffffffffd60;
  allocator local_1d1;
  string local_1d0 [37];
  byte local_1ab;
  byte local_1aa;
  allocator local_1a9;
  string local_1a8 [37];
  byte local_183;
  byte local_182;
  allocator local_181;
  string local_180 [37];
  byte local_15b;
  byte local_15a;
  allocator local_159;
  string local_158 [37];
  byte local_133;
  byte local_132;
  allocator local_131;
  string local_130 [37];
  byte local_10b;
  byte local_10a;
  allocator local_109;
  string local_108 [37];
  byte local_e3;
  byte local_e2;
  allocator local_e1;
  string local_e0 [37];
  byte local_bb;
  byte local_ba;
  allocator local_b9;
  string local_b8 [37];
  byte local_93;
  byte local_92;
  allocator local_91;
  string local_90 [37];
  byte local_6b;
  byte local_6a;
  allocator local_69;
  string local_68 [104];
  
  uVar3 = (undefined2)((ulong)in_stack_fffffffffffffd50 >> 0x30);
  bert::Regex::Regex(in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
  local_6a = 0;
  local_6b = 0;
  local_92 = 0;
  local_93 = 0;
  bVar1 = bert::Regex::Match((Regex *)in_stack_fffffffffffffd30,(char *)in_stack_fffffffffffffd28);
  if (bVar1) {
    std::allocator<char>::allocator();
    local_6a = 1;
    std::__cxx11::string::string(local_68,"\'t.Match(\"xyz\")\'",&local_69);
    local_6b = 1;
    UnitTestBase::SetInfo
              (in_stack_fffffffffffffd60,
               (string *)CONCAT17(in_stack_fffffffffffffd5f,in_stack_fffffffffffffd58),
               SUB21((ushort)uVar3 >> 8,0),SUB21(uVar3,0));
  }
  else {
    std::allocator<char>::allocator();
    local_92 = 1;
    std::__cxx11::string::string(local_90,"\'t.Match(\"xyz\")\'",&local_91);
    local_93 = 1;
    UnitTestBase::SetInfo
              (in_stack_fffffffffffffd60,
               (string *)CONCAT17(in_stack_fffffffffffffd5f,in_stack_fffffffffffffd58),
               SUB21((ushort)uVar3 >> 8,0),SUB21(uVar3,0));
  }
  MsgHelper::operator=((MsgHelper *)in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
  if ((local_93 & 1) != 0) {
    std::__cxx11::string::~string(local_90);
  }
  if ((local_92 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_91);
  }
  if ((local_6b & 1) != 0) {
    std::__cxx11::string::~string(local_68);
  }
  if ((local_6a & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_69);
  }
  local_ba = 0;
  local_bb = 0;
  local_e2 = 0;
  local_e3 = 0;
  bVar1 = bert::Regex::Match((Regex *)in_stack_fffffffffffffd30,(char *)in_stack_fffffffffffffd28);
  if (bVar1) {
    std::allocator<char>::allocator();
    local_e2 = 1;
    std::__cxx11::string::string(local_e0,"\'!(t.Match(\"a\"))\'",&local_e1);
    local_e3 = 1;
    UnitTestBase::SetInfo
              (in_stack_fffffffffffffd60,
               (string *)CONCAT17(in_stack_fffffffffffffd5f,in_stack_fffffffffffffd58),
               SUB21((ushort)uVar3 >> 8,0),SUB21(uVar3,0));
  }
  else {
    std::allocator<char>::allocator();
    local_ba = 1;
    std::__cxx11::string::string(local_b8,"\'!(t.Match(\"a\"))\'",&local_b9);
    local_bb = 1;
    UnitTestBase::SetInfo
              (in_stack_fffffffffffffd60,
               (string *)CONCAT17(in_stack_fffffffffffffd5f,in_stack_fffffffffffffd58),
               SUB21((ushort)uVar3 >> 8,0),SUB21(uVar3,0));
  }
  MsgHelper::operator=((MsgHelper *)in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
  if ((local_e3 & 1) != 0) {
    std::__cxx11::string::~string(local_e0);
  }
  if ((local_e2 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_e1);
  }
  if ((local_bb & 1) != 0) {
    std::__cxx11::string::~string(local_b8);
  }
  if ((local_ba & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_b9);
  }
  local_10a = 0;
  local_10b = 0;
  local_132 = 0;
  local_133 = 0;
  bVar1 = bert::Regex::Match((Regex *)in_stack_fffffffffffffd30,(char *)in_stack_fffffffffffffd28);
  if (bVar1) {
    std::allocator<char>::allocator();
    local_132 = 1;
    std::__cxx11::string::string(local_130,"\'!(t.Match(\"b\"))\'",&local_131);
    local_133 = 1;
    UnitTestBase::SetInfo
              (in_stack_fffffffffffffd60,
               (string *)CONCAT17(in_stack_fffffffffffffd5f,in_stack_fffffffffffffd58),
               SUB21((ushort)uVar3 >> 8,0),SUB21(uVar3,0));
  }
  else {
    std::allocator<char>::allocator();
    local_10a = 1;
    std::__cxx11::string::string(local_108,"\'!(t.Match(\"b\"))\'",&local_109);
    local_10b = 1;
    UnitTestBase::SetInfo
              (in_stack_fffffffffffffd60,
               (string *)CONCAT17(in_stack_fffffffffffffd5f,in_stack_fffffffffffffd58),
               SUB21((ushort)uVar3 >> 8,0),SUB21(uVar3,0));
  }
  MsgHelper::operator=((MsgHelper *)in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
  if ((local_133 & 1) != 0) {
    std::__cxx11::string::~string(local_130);
  }
  if ((local_132 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_131);
  }
  if ((local_10b & 1) != 0) {
    std::__cxx11::string::~string(local_108);
  }
  if ((local_10a & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_109);
  }
  local_15a = 0;
  local_15b = 0;
  local_182 = 0;
  local_183 = 0;
  bVar1 = bert::Regex::Match((Regex *)in_stack_fffffffffffffd30,(char *)in_stack_fffffffffffffd28);
  if (bVar1) {
    std::allocator<char>::allocator();
    local_182 = 1;
    std::__cxx11::string::string(local_180,"\'!(t.Match(\"abc\"))\'",&local_181);
    local_183 = 1;
    in_stack_fffffffffffffd60 =
         UnitTestBase::SetInfo
                   (in_stack_fffffffffffffd60,
                    (string *)CONCAT17(in_stack_fffffffffffffd5f,in_stack_fffffffffffffd58),
                    SUB21((ushort)uVar3 >> 8,0),SUB21(uVar3,0));
  }
  else {
    std::allocator<char>::allocator();
    local_15a = 1;
    std::__cxx11::string::string(local_158,"\'!(t.Match(\"abc\"))\'",&local_159);
    local_15b = 1;
    UnitTestBase::SetInfo
              (in_stack_fffffffffffffd60,
               (string *)CONCAT17(in_stack_fffffffffffffd5f,in_stack_fffffffffffffd58),
               SUB21((ushort)uVar3 >> 8,0),SUB21(uVar3,0));
  }
  MsgHelper::operator=((MsgHelper *)in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
  if ((local_183 & 1) != 0) {
    std::__cxx11::string::~string(local_180);
  }
  if ((local_182 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_181);
  }
  if ((local_15b & 1) != 0) {
    std::__cxx11::string::~string(local_158);
  }
  if ((local_15a & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_159);
  }
  local_1aa = 0;
  local_1ab = 0;
  bVar1 = bert::Regex::Match((Regex *)in_stack_fffffffffffffd30,(char *)in_stack_fffffffffffffd28);
  if (bVar1) {
    paVar2 = &local_1d1;
    uVar4 = bVar1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1d0,"\'!(t.Match(\"fuckabc\"))\'",paVar2);
    in_stack_fffffffffffffd30 =
         UnitTestBase::SetInfo
                   (in_stack_fffffffffffffd60,(string *)CONCAT17(uVar4,in_stack_fffffffffffffd58),
                    SUB21((ushort)uVar3 >> 8,0),SUB21(uVar3,0));
  }
  else {
    paVar2 = &local_1a9;
    uVar4 = bVar1;
    std::allocator<char>::allocator();
    local_1aa = 1;
    std::__cxx11::string::string(local_1a8,"\'!(t.Match(\"fuckabc\"))\'",paVar2);
    local_1ab = 1;
    UnitTestBase::SetInfo
              (in_stack_fffffffffffffd60,(string *)CONCAT17(uVar4,in_stack_fffffffffffffd58),
               SUB81((ulong)paVar2 >> 0x38,0),SUB81((ulong)paVar2 >> 0x30,0));
  }
  MsgHelper::operator=((MsgHelper *)in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
  if (bVar1) {
    std::__cxx11::string::~string(local_1d0);
    std::allocator<char>::~allocator((allocator<char> *)&local_1d1);
  }
  if ((local_1ab & 1) != 0) {
    std::__cxx11::string::~string(local_1a8);
  }
  if ((local_1aa & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_1a9);
  }
  bert::Regex::~Regex((Regex *)0x13ea3d);
  return;
}

Assistant:

TEST_CASE(hello11)
{
    Regex t("[^abc]*");
    EXPECT_TRUE(t.Match("xyz"));
    EXPECT_FALSE(t.Match("a"));
    EXPECT_FALSE(t.Match("b"));
    EXPECT_FALSE(t.Match("abc"));
    EXPECT_FALSE(t.Match("fuckabc"));
}